

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O0

vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
* anon_unknown.dwarf_efad74::GetInvTxfm2dParamList(void)

{
  undefined1 uVar1;
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  *in_RDI;
  TxSize tx_size;
  TxType tx_type;
  int t;
  double avg_error;
  int max_error;
  int s;
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  *param_list;
  value_type *__x;
  undefined7 in_stack_ffffffffffffffa0;
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  *this;
  value_type local_48 [2];
  TX_SIZE local_26;
  TX_TYPE local_25;
  int local_24;
  undefined8 local_20;
  undefined4 local_14;
  int local_10;
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  std::
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  ::vector((vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
            *)0x9dc6a0);
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    local_14 = *(undefined4 *)((anonymous_namespace)::max_error_ls + (long)local_10 * 4);
    local_20 = *(undefined8 *)((anonymous_namespace)::avg_error_ls + (long)local_10 * 8);
    for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
      local_25 = (TX_TYPE)local_24;
      local_26 = (TX_SIZE)local_10;
      uVar1 = libaom_test::IsTxSizeTypeValid((TX_SIZE)local_10,(TX_TYPE)local_24);
      if ((bool)uVar1) {
        __x = local_48;
        std::tuple<unsigned_char,_unsigned_char,_int,_double>::tuple<true,_true>
                  ((tuple<unsigned_char,_unsigned_char,_int,_double> *)this,(uchar *)in_RDI,
                   (uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),(int *)__x,(double *)0x9dc741)
        ;
        std::
        vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
        ::push_back((vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
                     *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),__x);
      }
    }
  }
  return this;
}

Assistant:

vector<AV1InvTxfm2dParam> GetInvTxfm2dParamList() {
  vector<AV1InvTxfm2dParam> param_list;
  for (int s = 0; s < TX_SIZES; ++s) {
    const int max_error = max_error_ls[s];
    const double avg_error = avg_error_ls[s];
    for (int t = 0; t < TX_TYPES; ++t) {
      const TxType tx_type = static_cast<TxType>(t);
      const TxSize tx_size = static_cast<TxSize>(s);
      if (libaom_test::IsTxSizeTypeValid(tx_size, tx_type)) {
        param_list.push_back(
            AV1InvTxfm2dParam(tx_type, tx_size, max_error, avg_error));
      }
    }
  }
  return param_list;
}